

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O1

void __thiscall hbm::streaming::StreamClient::stop(StreamClient *this)

{
  SocketNonblocking::stop(&this->m_streamSocket);
  (this->m_address)._M_string_length = 0;
  *(this->m_address)._M_dataplus._M_p = '\0';
  (this->m_streamId)._M_string_length = 0;
  *(this->m_streamId)._M_dataplus._M_p = '\0';
  (this->m_controlPort)._M_string_length = 0;
  *(this->m_controlPort)._M_dataplus._M_p = '\0';
  timeInfo::clear(&this->m_initialTime);
  return;
}

Assistant:

void StreamClient::stop()
		{
			m_streamSocket.stop();
			m_address.clear();
			m_streamId.clear();
			m_controlPort.clear();
			m_initialTime.clear();
		}